

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

undefined8 get_diget<cppcms::crypto::hmac>(hmac *d,string *source)

{
  ulong uVar1;
  void *in_RSI;
  undefined8 in_RDI;
  uint n;
  uchar buf [256];
  size_t in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  
  uVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  cppcms::crypto::hmac::append(in_RSI,uVar1);
  cppcms::crypto::hmac::digest_size();
  cppcms::crypto::hmac::readout(in_RSI);
  to_string_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

std::string get_diget(MD &d,std::string const &source)
{
	unsigned char buf[256];
	d.append(source.c_str(),source.size());
	unsigned n=d.digest_size();
	d.readout(buf);
	return to_string(buf,n);
}